

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> __thiscall
opts::Option<unsigned_int>(opts *this,char s,string *l,uint *var,string *help)

{
  OptionContainer<unsigned_int> *this_00;
  string local_50;
  
  this_00 = (OptionContainer<unsigned_int> *)operator_new(0x98);
  Traits<unsigned_int>::type_string_abi_cxx11_();
  OptionContainer<unsigned_int>::OptionContainer(this_00,s,l,var,help,&local_50);
  *(OptionContainer<unsigned_int> **)this = this_00;
  std::__cxx11::string::~string((string *)&local_50);
  return (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<BasicOption>
Option(char s, const std::string& l, T& var, const std::string& help)       { return std::unique_ptr<BasicOption>{new OptionContainer<T>(s, l, var, help)}; }